

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void do_cmd_knowledge_shapechange(char *name,wchar_t row)

{
  bitflag *flags;
  size_t len;
  ushort uVar1;
  uint uVar2;
  long lVar3;
  class_book *pcVar4;
  class_spell *pcVar5;
  byte bVar6;
  undefined4 uVar7;
  _Bool _Var8;
  wchar_t count;
  int iVar9;
  int iVar10;
  menu_iter *iter;
  void *base;
  textblock *tb;
  obj_property *poVar11;
  char **ppcVar12;
  textblock *tba;
  object_kind *poVar13;
  ulong uVar14;
  char *pcVar15;
  wchar_t n;
  wchar_t wVar16;
  int *piVar17;
  long lVar18;
  effect *peVar19;
  wchar_t wVar20;
  void *pvVar21;
  ulong uVar22;
  wchar_t n_00;
  player_shape **pppVar23;
  long lVar24;
  player_ability **pppVar25;
  player_class **pppVar26;
  menu *m;
  bool bVar27;
  ui_event uVar28;
  wchar_t local_338;
  wchar_t local_334;
  ui_event local_330;
  ui_event local_320;
  ulong local_310;
  wchar_t hnew;
  wchar_t wnew;
  menu *local_300;
  player_class *local_2f8;
  void *local_2f0;
  long local_2e8;
  object_kind *local_2e0;
  char *local_2d8 [4];
  region_conflict list_region;
  region_conflict header_region;
  char toa_msg [24];
  char tod_msg [24];
  char toh_msg [24];
  
  header_region.col = L'\0';
  header_region.row = L'\0';
  header_region.width = L'\xffffffff';
  header_region.page_rows = L'\x05';
  list_region.col = L'\0';
  list_region.row = L'\x06';
  list_region.width = L'\xffffffff';
  list_region.page_rows = L'\xfffffffe';
  count = count_interesting_shapes();
  if (count != L'\0') {
    iter = menu_find_iter(MN_ITER_STRINGS);
    local_300 = menu_new(MN_SKIN_SCROLL,iter);
    len = (long)count * 8;
    base = mem_alloc(len);
    uVar14 = 0;
    pppVar23 = &shapes;
    while (pppVar23 = &((player_shape *)pppVar23)->next->next,
          (player_shape *)pppVar23 != (player_shape *)0x0) {
      iVar9 = strcmp(((player_shape *)pppVar23)->name,"normal");
      if (iVar9 != 0) {
        *(player_shape ***)((long)base + uVar14 * 8) = pppVar23;
        uVar14 = (ulong)((int)uVar14 + 1);
      }
    }
    sort(base,(long)count,8,compare_shape_names);
    local_2f0 = mem_alloc(len);
    m = local_300;
    uVar22 = 0;
    uVar14 = 0;
    if (L'\0' < count) {
      uVar14 = (ulong)(uint)count;
    }
    for (; uVar14 != uVar22; uVar22 = uVar22 + 1) {
      *(undefined8 *)((long)local_2f0 + uVar22 * 8) =
           *(undefined8 *)(*(long *)((long)base + uVar22 * 8) + 8);
    }
    menu_setpriv(local_300,count,local_2f0);
    menu_layout(m,(region *)&list_region);
    *(byte *)&m->flags = (byte)m->flags | 0x10;
    screen_save();
    clear_from(L'\0');
    local_334 = L'\xffffffff';
    bVar6 = 1;
    bVar27 = true;
    local_338 = L'\0';
    local_310 = 0;
    while (uVar14 = local_310, bVar27) {
      local_320._8_4_ = 0;
      local_320.type = EVT_NONE;
      local_320.mouse.x = '\0';
      local_320.mouse.y = '\0';
      local_320.mouse.button = '\0';
      local_320.mouse.mods = '\0';
      Term_get_size(&wnew,&hnew);
      local_310 = (ulong)(uint)hnew;
      if (!(bool)((wchar_t)uVar14 == hnew & (bVar6 ^ 1))) {
        region_erase(&header_region);
        wVar16 = L'\0';
        prt("Knowledge - shapes",L'\x02',L'\0');
        prt("Name",L'\x04',L'\0');
        while( true ) {
          wVar20 = wnew;
          if (L'O' < wnew) {
            wVar20 = L'P';
          }
          if (wVar20 <= wVar16) break;
          Term_putch(wVar16,L'\x05',L'\x01',L'=');
          wVar16 = wVar16 + L'\x01';
        }
        prt("<dir>, \'r\' to recall, ESC",(int)local_310 + L'\xfffffffe',L'\0');
      }
      if (local_334 != local_338) {
        m->cursor = local_338;
        local_334 = local_338;
      }
      menu_refresh(m,false);
      handle_stuff(player);
      uVar28 = inkey_ex();
      local_330.mouse = uVar28.mouse;
      local_330.key.mods = uVar28.key.mods;
      if (uVar28.type == EVT_KBRD) {
        menu_handle_keypress(m,&local_330,&local_320);
      }
      else if (uVar28.type == EVT_MOUSE) {
        menu_handle_mouse(m,&local_330,&local_320);
      }
      if (local_320.type != EVT_NONE) {
        local_330._8_4_ = local_320._8_4_;
        local_330.mouse = local_320.mouse;
      }
      bVar27 = true;
      if (local_330.type == EVT_SELECT) {
        if (local_338 == m->cursor) {
LAB_001ca495:
          if ((local_338 < L'\0') || (count <= local_338)) {
            __assert_fail("mark >= 0 && mark < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                          ,0xc6e,"void do_cmd_knowledge_shapechange(const char *, int)");
          }
          lVar3 = *(long *)((long)base + (ulong)(uint)local_338 * 8);
          tb = textblock_new();
          textblock_append(tb,"%s",*(undefined8 *)(lVar3 + 8));
          textblock_append(tb,
                           "\nLike all shapes, the equipment at the time of the shapechange sets the base attributes, including damage per blow, number of blows and resistances.  While changed, items in your pack or on the floor (except for pickup or eating) are inaccessible.  To switch back to your normal shape, cast a spell or use an item command other than eat (drop, for instance).\n"
                          );
          bVar27 = *(int *)(lVar3 + 0x14) != 0;
          if (bVar27) {
            strnfmt(toa_msg,0x18,"%+d to AC");
            local_2d8[0] = toa_msg;
          }
          uVar14 = (ulong)bVar27;
          if (*(int *)(lVar3 + 0x18) != 0) {
            strnfmt(toh_msg,0x18,"%+d to hit");
            local_2d8[uVar14] = toh_msg;
            uVar14 = (ulong)(bVar27 + 1);
          }
          wVar16 = (wchar_t)uVar14;
          if (*(int *)(lVar3 + 0x1c) == 0) {
            if (wVar16 != L'\0') goto LAB_001ca57b;
          }
          else {
            strnfmt(tod_msg,0x18,"%+d to damage");
            local_2d8[uVar14] = tod_msg;
            wVar16 = wVar16 + L'\x01';
LAB_001ca57b:
            textblock_append(tb,"Adds");
            shape_lore_append_list(tb,local_2d8,wVar16);
            textblock_append(tb,".\n");
          }
          toa_msg[0] = '\0';
          toa_msg[1] = '\0';
          toa_msg[2] = '\0';
          toa_msg[3] = '\0';
          toa_msg[4] = '\0';
          toa_msg[5] = '\0';
          toa_msg[6] = '\0';
          toa_msg[7] = '\0';
          toh_msg[0] = '\0';
          toh_msg[1] = '\0';
          toh_msg[2] = '\0';
          toh_msg[3] = '\0';
          tod_msg[0] = '\0';
          tod_msg[1] = '\0';
          tod_msg[2] = '\0';
          tod_msg[3] = '\0';
          piVar17 = &DAT_00266494;
          for (uVar14 = 0; uVar7 = tod_msg._0_4_, uVar14 != 10; uVar14 = uVar14 + 1) {
            uVar2 = *(uint *)(lVar3 + 0x20 + uVar14 * 4);
            if (uVar2 != 0) {
              pcVar15 = "unknown skill";
              if (uVar14 < 10) {
                pcVar15 = (char *)((long)&DAT_00266494 + (long)*piVar17);
              }
              pcVar15 = format("%+d to %s",(ulong)uVar2,pcVar15);
              shape_lore_helper_append_to_list
                        (pcVar15,(char ***)toa_msg,(int *)toh_msg,(int *)tod_msg);
            }
            piVar17 = piVar17 + 1;
          }
          lVar18 = (long)(int)tod_msg._0_4_;
          pvVar21 = (void *)toa_msg._0_8_;
          if (0 < lVar18) {
            textblock_append(tb,"Adds");
            pvVar21 = (void *)toa_msg._0_8_;
            shape_lore_append_list(tb,(char **)toa_msg._0_8_,uVar7);
            textblock_append(tb,".\n");
            for (lVar24 = 0; lVar18 != lVar24; lVar24 = lVar24 + 1) {
              string_free(*(char **)((long)pvVar21 + lVar24 * 8));
            }
          }
          mem_free(pvVar21);
          toa_msg[0] = '\0';
          toa_msg[1] = '\0';
          toa_msg[2] = '\0';
          toa_msg[3] = '\0';
          toa_msg[4] = '\0';
          toa_msg[5] = '\0';
          toa_msg[6] = '\0';
          toa_msg[7] = '\0';
          toh_msg[0] = '\0';
          toh_msg[1] = '\0';
          toh_msg[2] = '\0';
          toh_msg[3] = '\0';
          tod_msg[0] = '\0';
          tod_msg[1] = '\0';
          tod_msg[2] = '\0';
          tod_msg[3] = '\0';
          for (lVar18 = 0; uVar7 = tod_msg._0_4_, lVar18 != 0xb; lVar18 = lVar18 + 1) {
            uVar2 = *(uint *)(lVar3 + 100 + lVar18 * 4);
            if (uVar2 != 0) {
              poVar11 = lookup_obj_property(2,(int)lVar18 + 5);
              pcVar15 = format("%+d to %s",(ulong)uVar2,poVar11->name);
              shape_lore_helper_append_to_list
                        (pcVar15,(char ***)toa_msg,(int *)toh_msg,(int *)tod_msg);
            }
          }
          lVar18 = (long)(int)tod_msg._0_4_;
          pvVar21 = (void *)toa_msg._0_8_;
          if (0 < lVar18) {
            textblock_append(tb,"Adds");
            pvVar21 = (void *)toa_msg._0_8_;
            shape_lore_append_list(tb,(char **)toa_msg._0_8_,uVar7);
            textblock_append(tb,".\n");
            for (lVar24 = 0; lVar18 != lVar24; lVar24 = lVar24 + 1) {
              string_free(*(char **)((long)pvVar21 + lVar24 * 8));
            }
          }
          mem_free(pvVar21);
          toa_msg[0] = '\0';
          toa_msg[1] = '\0';
          toa_msg[2] = '\0';
          toa_msg[3] = '\0';
          toa_msg[4] = '\0';
          toa_msg[5] = '\0';
          toa_msg[6] = '\0';
          toa_msg[7] = '\0';
          toh_msg[0] = '\0';
          toh_msg[1] = '\0';
          toh_msg[2] = '\0';
          toh_msg[3] = '\0';
          tod_msg[0] = '\0';
          tod_msg[1] = '\0';
          tod_msg[2] = '\0';
          tod_msg[3] = '\0';
          for (lVar18 = 0; uVar7 = tod_msg._0_4_, lVar18 != 5; lVar18 = lVar18 + 1) {
            uVar2 = *(uint *)(lVar3 + 0x50 + lVar18 * 4);
            if (uVar2 != 0) {
              poVar11 = lookup_obj_property(2,(int)lVar18);
              pcVar15 = format("%+d to %s",(ulong)uVar2,poVar11->name);
              shape_lore_helper_append_to_list
                        (pcVar15,(char ***)toa_msg,(int *)toh_msg,(int *)tod_msg);
            }
          }
          lVar18 = (long)(int)tod_msg._0_4_;
          pvVar21 = (void *)toa_msg._0_8_;
          if (0 < lVar18) {
            textblock_append(tb,"Adds");
            pvVar21 = (void *)toa_msg._0_8_;
            shape_lore_append_list(tb,(char **)toa_msg._0_8_,uVar7);
            textblock_append(tb,".\n");
            for (lVar24 = 0; lVar18 != lVar24; lVar24 = lVar24 + 1) {
              string_free(*(char **)((long)pvVar21 + lVar24 * 8));
            }
          }
          mem_free(pvVar21);
          ppcVar12 = &projections->name;
          wVar20 = L'\0';
          n_00 = L'\0';
          wVar16 = L'\0';
          for (lVar18 = 0; lVar18 != 0x19; lVar18 = lVar18 + 1) {
            uVar1 = *(ushort *)(lVar3 + 0x90 + lVar18 * 4);
            if ((short)uVar1 < 0) {
              *(char **)(toa_msg + (long)wVar20 * 8) = *ppcVar12;
              wVar20 = wVar20 + L'\x01';
            }
            else if (uVar1 < 3) {
              if (uVar1 != 0) {
                *(char **)(toh_msg + (long)n_00 * 8) = *ppcVar12;
                n_00 = n_00 + L'\x01';
              }
            }
            else {
              *(char **)(tod_msg + (long)wVar16 * 8) = *ppcVar12;
              wVar16 = wVar16 + L'\x01';
            }
            ppcVar12 = ppcVar12 + 0xd;
          }
          if (wVar20 != L'\0') {
            textblock_append(tb,"Makes you vulnerable to");
            shape_lore_append_list(tb,(char **)toa_msg,wVar20);
            textblock_append(tb,".\n");
          }
          if (n_00 != L'\0') {
            textblock_append(tb,"Makes you resistant to");
            shape_lore_append_list(tb,(char **)toh_msg,n_00);
            textblock_append(tb,".\n");
          }
          if (wVar16 != L'\0') {
            textblock_append(tb,"Makes you immune to");
            shape_lore_append_list(tb,(char **)tod_msg,wVar16);
            textblock_append(tb,".\n");
          }
          toa_msg[0] = '\0';
          toa_msg[1] = '\0';
          toa_msg[2] = '\0';
          toa_msg[3] = '\0';
          toa_msg[4] = '\0';
          toa_msg[5] = '\0';
          toa_msg[6] = '\0';
          toa_msg[7] = '\0';
          toh_msg[0] = '\0';
          toh_msg[1] = '\0';
          toh_msg[2] = '\0';
          toh_msg[3] = '\0';
          tod_msg[0] = '\0';
          tod_msg[1] = '\0';
          tod_msg[2] = '\0';
          tod_msg[3] = '\0';
          flags = (bitflag *)(lVar3 + 0x48);
          for (iVar9 = 1; uVar7 = tod_msg._0_4_, iVar9 != 0x27; iVar9 = iVar9 + 1) {
            poVar11 = lookup_obj_property(3,iVar9);
            if ((poVar11->subtype == L'\x02') &&
               (_Var8 = flag_has_dbg(flags,5,poVar11->index,"s->flags","prop->index"), _Var8)) {
              shape_lore_helper_append_to_list
                        (poVar11->desc,(char ***)toa_msg,(int *)toh_msg,(int *)tod_msg);
            }
          }
          lVar18 = (long)(int)tod_msg._0_4_;
          pvVar21 = (void *)toa_msg._0_8_;
          if (0 < lVar18) {
            textblock_append(tb,"Provides protection from");
            pvVar21 = (void *)toa_msg._0_8_;
            shape_lore_append_list(tb,(char **)toa_msg._0_8_,uVar7);
            textblock_append(tb,".\n");
            for (lVar24 = 0; lVar18 != lVar24; lVar24 = lVar24 + 1) {
              string_free(*(char **)((long)pvVar21 + lVar24 * 8));
            }
          }
          mem_free(pvVar21);
          toa_msg[0] = '\0';
          toa_msg[1] = '\0';
          toa_msg[2] = '\0';
          toa_msg[3] = '\0';
          toa_msg[4] = '\0';
          toa_msg[5] = '\0';
          toa_msg[6] = '\0';
          toa_msg[7] = '\0';
          toh_msg[0] = '\0';
          toh_msg[1] = '\0';
          toh_msg[2] = '\0';
          toh_msg[3] = '\0';
          tod_msg[0] = '\0';
          tod_msg[1] = '\0';
          tod_msg[2] = '\0';
          tod_msg[3] = '\0';
          for (iVar9 = 0; uVar7 = tod_msg._0_4_, iVar9 != 5; iVar9 = iVar9 + 1) {
            poVar11 = lookup_obj_property(1,iVar9);
            iVar10 = sustain_flag(poVar11->index);
            _Var8 = flag_has_dbg(flags,5,iVar10,"s->flags","sustain_flag(prop->index)");
            if (_Var8) {
              shape_lore_helper_append_to_list
                        (poVar11->name,(char ***)toa_msg,(int *)toh_msg,(int *)tod_msg);
            }
          }
          lVar18 = (long)(int)tod_msg._0_4_;
          pvVar21 = (void *)toa_msg._0_8_;
          if (0 < lVar18) {
            textblock_append(tb,"Sustains");
            pvVar21 = (void *)toa_msg._0_8_;
            shape_lore_append_list(tb,(char **)toa_msg._0_8_,uVar7);
            textblock_append(tb,".\n");
            for (lVar24 = 0; lVar18 != lVar24; lVar24 = lVar24 + 1) {
              string_free(*(char **)((long)pvVar21 + lVar24 * 8));
            }
          }
          mem_free(pvVar21);
          iVar10 = 0;
          for (iVar9 = 1; iVar9 != 0x27; iVar9 = iVar9 + 1) {
            poVar11 = lookup_obj_property(3,iVar9);
            if ((((uint)poVar11->subtype < 7) && ((0x68U >> (poVar11->subtype & 0x1fU) & 1) != 0))
               && (_Var8 = flag_has_dbg(flags,5,poVar11->index,"s->flags","prop->index"), _Var8)) {
              pcVar15 = "";
              if (0 < iVar10) {
                pcVar15 = "  ";
              }
              textblock_append(tb,"%s%s.",pcVar15);
              iVar10 = iVar10 + 1;
            }
          }
          pppVar25 = &player_abilities;
          while (pppVar25 = &((player_ability *)pppVar25)->next->next,
                (player_ability *)pppVar25 != (player_ability *)0x0) {
            iVar9 = strcmp(((player_ability *)pppVar25)->type,"player");
            if ((iVar9 == 0) &&
               (_Var8 = flag_has_dbg((bitflag *)(lVar3 + 0x4d),3,
                                     (uint)((player_ability *)pppVar25)->index,"s->pflags",
                                     "ability->index"), _Var8)) {
              pcVar15 = "";
              if (0 < iVar10) {
                pcVar15 = "  ";
              }
              textblock_append(tb,"%s%s",pcVar15);
              iVar10 = iVar10 + 1;
            }
          }
          if (0 < iVar10) {
            textblock_append(tb,"\n");
          }
          tba = effect_describe(*(effect **)(lVar3 + 0xf8),"Changing into the shape ",0,false);
          if (tba != (textblock *)0x0) {
            textblock_append_textblock(tb,tba);
            textblock_free(tba);
            textblock_append(tb,".\n");
          }
          iVar9 = 0;
          pppVar26 = &classes;
          while (pppVar26 = &((player_class *)pppVar26)->next->next,
                (player_class *)pppVar26 != (player_class *)0x0) {
            lVar18 = 0;
            local_2f8 = (player_class *)pppVar26;
            while (lVar18 < (((player_class *)pppVar26)->magic).num_books) {
              pcVar4 = (((player_class *)pppVar26)->magic).books;
              local_2e8 = lVar18;
              poVar13 = lookup_kind(pcVar4[lVar18].tval,pcVar4[lVar18].sval);
              if ((poVar13 != (object_kind *)0x0) && (poVar13->name != (char *)0x0)) {
                local_2e0 = poVar13;
                for (lVar24 = 0; pppVar26 = &local_2f8->next, lVar24 < pcVar4[lVar18].num_spells;
                    lVar24 = lVar24 + 1) {
                  pcVar5 = pcVar4[lVar18].spells;
                  peVar19 = (effect *)&pcVar5[lVar24].effect;
                  while (peVar19 = peVar19->next, peVar19 != (effect *)0x0) {
                    if ((peVar19->index == 0x62) && (peVar19->subtype == *(wchar_t *)(lVar3 + 0x10))
                       ) {
                      if (iVar9 == 0) {
                        textblock_append(tb,"\n");
                      }
                      textblock_append(tb,"The %s spell, %s, from %s triggers the shapechange.",
                                       local_2f8->name,pcVar5[lVar24].name,local_2e0->name);
                      iVar9 = iVar9 + 1;
                    }
                  }
                }
              }
              lVar18 = local_2e8 + 1;
            }
          }
          if (0 < iVar9) {
            textblock_append(tb,"\n");
          }
          textui_textblock_show(tb,(region_conflict)ZEXT816(0),(char *)0x0);
          textblock_free(tb);
          bVar27 = true;
          m = local_300;
        }
      }
      else if (local_330.type == EVT_ESCAPE) {
        bVar27 = false;
      }
      else if (local_330.type == EVT_MOVE) {
        local_338 = m->cursor;
      }
      else if ((local_330.type == EVT_KBRD) && ((local_330.key.code & 0xffffffdf) == 0x52))
      goto LAB_001ca495;
      bVar6 = 0;
    }
    screen_load();
    mem_free(local_2f0);
    mem_free(base);
    menu_free(m);
  }
  return;
}

Assistant:

static void do_cmd_knowledge_shapechange(const char *name, int row)
{
	region header_region = { 0, 0, -1, 5 };
	region list_region = { 0, 6, -1, -2 };
	int count = count_interesting_shapes();
	struct menu* m;
	struct player_shape **sarray;
	const char **narray;
	int h, mark, mark_old;
	bool displaying, redraw;
	struct player_shape *s;
	int i;

	if (!count) {
		return;
	}

	m = menu_new(MN_SKIN_SCROLL, menu_find_iter(MN_ITER_STRINGS));

	/* Set up an easily indexable list of the interesting shapes. */
	sarray = mem_alloc(count * sizeof(*sarray));
	for (s = shapes, i = 0; s; s = s->next) {
		if (streq(s->name, "normal")) {
			continue;
		}
		sarray[i] = s;
		++i;
	}

	/*
	 * Sort them alphabetically by name and set up an array with just the
	 * names.
	 */
	sort(sarray, count, sizeof(sarray[0]), compare_shape_names);
	narray = mem_alloc(count * sizeof(*narray));
	for (i = 0; i < count; ++i) {
		narray[i] = sarray[i]->name;
	}

	menu_setpriv(m, count, narray);
	menu_layout(m, &list_region);
	m->flags |= MN_DBL_TAP;

	screen_save();
	clear_from(0);

	h = 0;
	mark = 0;
	mark_old = -1;
	displaying = true;
	redraw = true;
	while (displaying) {
		bool recall = false;
		int wnew, hnew;
		ui_event ke0 = EVENT_EMPTY;
		ui_event ke;

		Term_get_size(&wnew, &hnew);
		if (h != hnew) {
			h = hnew;
			redraw = true;
		}

		if (redraw) {
			region_erase(&header_region);
			prt("Knowledge - shapes", 2, 0);
			prt("Name", 4, 0);
			for (i = 0; i < MIN(80, wnew); i++) {
				Term_putch(i, 5, COLOUR_WHITE, L'=');
			}
			prt("<dir>, 'r' to recall, ESC", h - 2, 0);
			redraw = false;
		}

		if (mark_old != mark) {
			mark_old = mark;
			m->cursor = mark;
		}

		menu_refresh(m, false);

		handle_stuff(player);

		ke = inkey_ex();
		if (ke.type == EVT_MOUSE) {
			menu_handle_mouse(m, &ke, &ke0);
		} else if (ke.type == EVT_KBRD) {
			menu_handle_keypress(m, &ke, &ke0);
		}
		if (ke0.type != EVT_NONE) {
			ke = ke0;
		}

		switch (ke.type) {
			case EVT_KBRD:
				if (ke.key.code == 'r' || ke.key.code == 'R') {
					recall = true;
				}
				break;

			case EVT_ESCAPE:
				displaying = false;
				break;

			case EVT_SELECT:
				if (mark == m->cursor) {
					recall = true;
				}
				break;

			case EVT_MOVE:
				mark = m->cursor;
				break;

			default:
				break;
		}

		if (recall) {
			assert(mark >= 0 && mark < count);
			shape_lore(sarray[mark]);
		}
	}

	screen_load();

	mem_free(narray);
	mem_free(sarray);
	menu_free(m);
}